

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::ImageTargetGLES2::~ImageTargetGLES2(ImageTargetGLES2 *this)

{
  ImageTestCase::~ImageTestCase(&this->super_ImageTestCase);
  operator_delete(this,0x1ad0);
  return;
}

Assistant:

static const char* getTargetName (GLenum target)
	{
		switch (target)
		{
			case GL_TEXTURE_2D:		return "tex2d";
			case GL_RENDERBUFFER:	return "renderbuffer";
			default:
				DE_ASSERT(DE_FALSE);
				return "";
		}
	}